

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psocks.c
# Opt level: O0

PsocksDataSink * open_pipes(char *cmd,char **direction_args,char *index_arg,char **err)

{
  char *pcVar1;
  FILE *pFVar2;
  int *piVar3;
  void *pvVar4;
  ulong local_78;
  size_t i_2;
  PsocksDataSinkPopen *pdsp;
  size_t i_1;
  char *command;
  size_t i;
  char *errmsg;
  FILE *fp [2];
  char **err_local;
  char *index_arg_local;
  char **direction_args_local;
  char *cmd_local;
  
  i = 0;
  for (command = (char *)0x0; command < (char *)0x2; command = command + 1) {
    pcVar1 = dupprintf("%s %s %s",cmd,direction_args[(long)command],index_arg);
    pFVar2 = popen(pcVar1,"w");
    fp[(long)(command + -1)] = (FILE *)pFVar2;
    safefree(pcVar1);
    if ((fp[(long)(command + -1)] == (FILE *)0x0) && (i == 0)) {
      piVar3 = __errno_location();
      pcVar1 = strerror(*piVar3);
      i = (size_t)dupprintf("%s",pcVar1);
    }
  }
  if (i == 0) {
    pvVar4 = safemalloc(1,0x58,0);
    for (local_78 = 0; local_78 < 2; local_78 = local_78 + 1) {
      setvbuf((FILE *)fp[local_78 - 1],(char *)0x0,2,0);
      stdio_sink_init((stdio_sink *)((long)pvVar4 + local_78 * 0x20),fp[local_78 - 1]);
      *(ulong *)((long)pvVar4 + local_78 * 8 + 0x48) = (long)pvVar4 + local_78 * 0x20 + 8;
    }
    *(code **)((long)pvVar4 + 0x40) = popen_free;
    cmd_local = (char *)((long)pvVar4 + 0x40);
  }
  else {
    for (pdsp = (PsocksDataSinkPopen *)0x0; pdsp < (PsocksDataSinkPopen *)0x2;
        pdsp = (PsocksDataSinkPopen *)((long)&pdsp->sink[0].fp + 1)) {
      if (fp[(long)((long)pdsp[-1].pds.s + 0xf)] != (FILE *)0x0) {
        pclose((FILE *)fp[(long)((long)pdsp[-1].pds.s + 0xf)]);
      }
    }
    *err = (char *)i;
    cmd_local = (char *)0x0;
  }
  return (PsocksDataSink *)cmd_local;
}

Assistant:

static PsocksDataSink *open_pipes(
    const char *cmd, const char *const *direction_args,
    const char *index_arg, char **err)
{
    FILE *fp[2];
    char *errmsg = NULL;

    for (size_t i = 0; i < 2; i++) {
        /* No escaping needed: the provided command is already
         * shell-quoted, and our extra arguments are simple */
        char *command = dupprintf("%s %s %s", cmd,
                                  direction_args[i], index_arg);

        fp[i] = popen(command, "w");
        sfree(command);

        if (!fp[i]) {
            if (!errmsg)
                errmsg = dupprintf("%s", strerror(errno));
        }
    }

    if (errmsg) {
        for (size_t i = 0; i < 2; i++)
            if (fp[i])
                pclose(fp[i]);
        *err = errmsg;
        return NULL;
    }

    PsocksDataSinkPopen *pdsp = snew(PsocksDataSinkPopen);

    for (size_t i = 0; i < 2; i++) {
        setvbuf(fp[i], NULL, _IONBF, 0);
        stdio_sink_init(&pdsp->sink[i], fp[i]);
        pdsp->pds.s[i] = BinarySink_UPCAST(&pdsp->sink[i]);
    }

    pdsp->pds.free = popen_free;

    return &pdsp->pds;
}